

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_system_linux.c
# Opt level: O0

void os_system_linux_netlink_remove(os_system_netlink *nl)

{
  os_fd *poVar1;
  os_system_netlink *nl_local;
  int result;
  
  if (((nl->socket).fd._flags & OS_FD_ACTIVE) != 0) {
    oonf_socket_remove(&nl->socket);
    poVar1 = &(nl->socket).fd;
    if (poVar1->fd != -1) {
      close(poVar1->fd);
      poVar1->fd = -1;
    }
    free(nl->in);
    abuf_free(&nl->out);
  }
  return;
}

Assistant:

void
os_system_linux_netlink_remove(struct os_system_netlink *nl) {
  if (os_fd_is_initialized(&nl->socket.fd)) {
    oonf_socket_remove(&nl->socket);

    os_fd_close(&nl->socket.fd);
    free(nl->in);
    abuf_free(&nl->out);
  }
}